

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

bool pg::au(int *dst,int *src,int d,int k,int max,int maxopp,int pl)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  int i;
  int iVar6;
  uint uVar7;
  undefined8 in_RAX;
  ulong uVar8;
  ulong uVar9;
  undefined4 *puVar10;
  ulong uVar11;
  pg *this;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_38 = (undefined8 *)CONCAT44((int)((ulong)in_RAX >> 0x20),maxopp);
  uStack_40 = 0x1627cc;
  iVar6 = up(dst,src,d,k,pl);
  if (iVar6 == -1) {
    return (bool)(char)iVar6;
  }
  lVar4 = -((ulong)(uint)k * 4 + 0xf & 0xfffffffffffffff0);
  this = (pg *)((long)&local_38 + lVar4);
  uVar7 = k - 2;
  *(undefined8 *)((long)&uStack_40 + lVar4) = 1;
  while( true ) {
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 0) goto LAB_00162984;
    uVar3 = src[uVar8];
    if (uVar3 == 0xffffffff) break;
    if ((uVar3 & 1) != pl) {
      if ((int)*(undefined8 *)((long)&uStack_40 + lVar4) - pl < (int)uVar3) {
        *(uint *)(this + uVar8 * 4) = uVar3 - 2;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(int *)(this + uVar11 * 4) = src[uVar11];
        }
        puVar10 = (undefined4 *)((long)&local_38 + uVar8 * 4 + lVar4 + 4);
        while (uVar7 = uVar7 + 1, (int)uVar7 < k) {
          *puVar10 = 0xffffffff;
          puVar10 = puVar10 + 1;
        }
      }
      else {
        if ((uVar7 == 0) || (src[uVar8 - 1] < pl)) goto LAB_0016284e;
        *(int *)(this + uVar8 * 4) = pl;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(int *)(this + uVar11 * 4) = src[uVar11];
        }
        puVar10 = (undefined4 *)((long)&local_38 + uVar8 * 4 + lVar4 + 4);
        while (uVar7 = uVar7 + 1, (int)uVar7 < k) {
          *puVar10 = 0xffffffff;
          puVar10 = puVar10 + 1;
        }
      }
      goto LAB_00162924;
    }
    iVar6 = uVar3 + 2;
    if ((uVar7 != 0 && iVar6 <= max) && (iVar6 <= src[uVar8 - 1])) {
      *(int *)(this + uVar8 * 4) = iVar6;
      for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        *(int *)(this + uVar11 * 4) = src[uVar11];
      }
      puVar10 = (undefined4 *)((long)&local_38 + uVar8 * 4 + lVar4 + 4);
      while (uVar7 = uVar7 + 1, (int)uVar7 < k) {
        *puVar10 = 0xffffffff;
        puVar10 = puVar10 + 1;
      }
      goto LAB_00162924;
    }
LAB_0016284e:
    uVar7 = uVar7 - 1;
  }
  *(undefined4 *)(this + uVar8 * 4) = (undefined4)local_38;
  for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    *(int *)(this + uVar11 * 4) = src[uVar11];
  }
  puVar10 = (undefined4 *)((long)&local_38 + uVar8 * 4 + lVar4 + 4);
  while (uVar7 = uVar7 + 1, (int)uVar7 < k) {
    *puVar10 = 0xffffffff;
    puVar10 = puVar10 + 1;
  }
LAB_00162924:
  local_38 = &local_38;
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x162935;
  iVar6 = pl;
  up((int *)this,(int *)this,d,k,pl);
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x162946;
  bVar5 = pm_less(this,dst,(int *)(ulong)(uint)k,pl,iVar6);
  uVar11 = (ulong)(uint)(~(k >> 0x1f) & k);
  if (bVar5) {
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      dst[uVar8] = *(int *)(this + uVar8 * 4);
    }
  }
  uVar9 = 0;
  do {
    uVar8 = uVar9;
    if (uVar11 == uVar9) break;
    piVar1 = dst + uVar9;
    uVar8 = uVar9 + 1;
    piVar2 = src + uVar9;
    uVar9 = uVar8;
  } while (*piVar1 == *piVar2);
LAB_00162984:
  return (bool)(char)uVar8;
}

Assistant:

static bool
au(int *dst, int *src, int d, int k, int max, int maxopp, int pl)
{
    // first compute normal update
    int j = up(dst, src, d, k, pl);
    if (j == -1) return false; // no difference, already smallest...

    // then compute antagonistic update and update the antagonistic measure
    int tmp[k];
    if (!bump(tmp, src, k, max, maxopp, pl)) return true; // no bump possible; but dst != src so return true
    up(tmp, tmp, d, k, pl);

    // use smallest updated measure
    if (pm_less(tmp, dst, k, pl)) {
        for (int i=0; i<k; i++) dst[i] = tmp[i];
    }

    // finally, check if different
    for (int i=0; i<k; i++) if (dst[i] != src[i]) return true;
    return false;
}